

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<58UL> * __thiscall
mserialize::cx_strcat<9ul,2ul,24ul,2ul,12ul,3ul,1ul,3ul,1ul,1ul>
          (cx_string<58UL> *__return_storage_ptr__,mserialize *this,cx_string<9UL> *strings,
          cx_string<2UL> *strings_1,cx_string<24UL> *strings_2,cx_string<2UL> *strings_3,
          cx_string<12UL> *strings_4,cx_string<3UL> *strings_5,cx_string<1UL> *strings_6,
          cx_string<3UL> *strings_7,cx_string<1UL> *strings_8,cx_string<1UL> *strings_9)

{
  long lVar1;
  ulong uVar2;
  size_t *psVar3;
  char buffer [59];
  ulong local_108 [12];
  long local_a8;
  mserialize *local_a0;
  cx_string<9UL> *local_98;
  cx_string<2UL> *local_90;
  cx_string<24UL> *local_88;
  size_t size [11];
  
  psVar3 = size + 7;
  size[9] = 0;
  size[10] = 0;
  size[7] = 0;
  size[8] = 0;
  local_a0 = this;
  local_98 = strings;
  local_90 = strings_1;
  local_88 = strings_2;
  size[0] = (size_t)strings_3;
  size[1] = (size_t)strings_4;
  size[2] = (size_t)strings_5;
  size[3] = (size_t)strings_6;
  size[4] = (size_t)strings_7;
  size[5] = (size_t)strings_8;
  local_108[1] = 9;
  local_108[2] = 2;
  local_108[3] = 0x18;
  local_108[4] = 2;
  local_108[5] = 0xc;
  local_108[6] = 3;
  lVar1 = 1;
  local_108[7] = 1;
  local_108[8] = 3;
  local_108[9] = 1;
  local_108[10] = 1;
  do {
    if (local_108[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)psVar3 + uVar2) = *(undefined1 *)((&local_a8)[lVar1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_108[lVar1]);
      psVar3 = (size_t *)((long)psVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xb);
  __return_storage_ptr__->_data[0x3a] = '\0';
  *(size_t *)__return_storage_ptr__->_data = size[7];
  *(size_t *)(__return_storage_ptr__->_data + 8) = size[8];
  *(size_t *)(__return_storage_ptr__->_data + 0x10) = size[9];
  *(size_t *)(__return_storage_ptr__->_data + 0x18) = size[10];
  __return_storage_ptr__->_data[0x20] = '\0';
  __return_storage_ptr__->_data[0x21] = '\0';
  __return_storage_ptr__->_data[0x22] = '\0';
  __return_storage_ptr__->_data[0x23] = '\0';
  __return_storage_ptr__->_data[0x24] = '\0';
  __return_storage_ptr__->_data[0x25] = '\0';
  __return_storage_ptr__->_data[0x26] = '\0';
  __return_storage_ptr__->_data[0x27] = '\0';
  __return_storage_ptr__->_data[0x28] = '\0';
  __return_storage_ptr__->_data[0x29] = '\0';
  __return_storage_ptr__->_data[0x2a] = '\0';
  __return_storage_ptr__->_data[0x2b] = '\0';
  __return_storage_ptr__->_data[0x2c] = '\0';
  __return_storage_ptr__->_data[0x2d] = '\0';
  __return_storage_ptr__->_data[0x2e] = '\0';
  __return_storage_ptr__->_data[0x2f] = '\0';
  __return_storage_ptr__->_data[0x2a] = '\0';
  __return_storage_ptr__->_data[0x2b] = '\0';
  __return_storage_ptr__->_data[0x2c] = '\0';
  __return_storage_ptr__->_data[0x2d] = '\0';
  __return_storage_ptr__->_data[0x2e] = '\0';
  __return_storage_ptr__->_data[0x2f] = '\0';
  __return_storage_ptr__->_data[0x30] = '\0';
  __return_storage_ptr__->_data[0x31] = '\0';
  __return_storage_ptr__->_data[0x32] = '\0';
  __return_storage_ptr__->_data[0x33] = '\0';
  __return_storage_ptr__->_data[0x34] = '\0';
  __return_storage_ptr__->_data[0x35] = '\0';
  __return_storage_ptr__->_data[0x36] = '\0';
  __return_storage_ptr__->_data[0x37] = '\0';
  __return_storage_ptr__->_data[0x38] = '\0';
  __return_storage_ptr__->_data[0x39] = '\0';
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}